

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# none.hpp
# Opt level: O0

string * __thiscall
websocketpp::transport::asio::basic_socket::connection::get_remote_endpoint_abi_cxx11_
          (string *__return_storage_ptr__,connection *this,error_code *ec)

{
  error_code *this_00;
  bool bVar1;
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *this_01;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  error_category *peVar4;
  error_code eVar5;
  error_code ec_00;
  error_code local_240;
  undefined4 local_22c;
  string local_228;
  undefined8 local_208;
  error_code eStack_200;
  error_category *peStack_1f0;
  undefined1 local_1d4 [8];
  endpoint ep;
  error_code aec;
  stringstream s;
  ostream local_198 [376];
  error_code *local_20;
  error_code *ec_local;
  connection *this_local;
  
  local_20 = ec;
  ec_local = (error_code *)this;
  this_local = (connection *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&aec.cat_);
  this_00 = (error_code *)((long)&ep.impl_.data_.v6.sin6_addr.__in6_u + 0xc);
  boost::system::error_code::error_code(this_00);
  this_01 = &std::
             __shared_ptr_access<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_socket)->
             super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ;
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::remote_endpoint((endpoint_type *)local_1d4,this_01,this_00);
  bVar1 = boost::system::error_code::operator_cast_to_bool
                    ((error_code *)((long)&ep.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
  if (bVar1) {
    eVar5 = asio::error::make_error_code(pass_through);
    peStack_1f0 = eVar5._M_cat;
    eStack_200.cat_._0_4_ = eVar5._M_value;
    peVar4 = (error_category *)(ulong)(uint)eStack_200.cat_;
    *(ulong *)local_20 = CONCAT44(eStack_200.cat_._4_4_,(uint)eStack_200.cat_);
    local_20->_M_cat = peStack_1f0;
    poVar2 = std::operator<<(local_198,"Error getting remote endpoint: ");
    local_208 = ep.impl_.data_._20_8_;
    eStack_200.val_ = aec.val_;
    eStack_200.failed_ = aec.failed_;
    eStack_200._5_3_ = aec._5_3_;
    ec_00.cat_ = peVar4;
    ec_00.val_ = aec.val_;
    ec_00.failed_ = aec.failed_;
    ec_00._5_3_ = aec._5_3_;
    pbVar3 = boost::system::operator<<
                       ((system *)poVar2,
                        (basic_ostream<char,_std::char_traits<char>_> *)ep.impl_.data_._20_8_,ec_00)
    ;
    poVar2 = std::operator<<(pbVar3," (");
    boost::system::error_code::message_abi_cxx11_
              (&local_228,(error_code *)((long)&ep.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
    poVar2 = std::operator<<(poVar2,(string *)&local_228);
    std::operator<<(poVar2,")");
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::stringstream::str();
  }
  else {
    std::error_code::error_code(&local_240);
    local_20->_M_value = local_240._M_value;
    *(undefined4 *)&local_20->field_0x4 = local_240._4_4_;
    local_20->_M_cat = local_240._M_cat;
    boost::asio::ip::operator<<(local_198,(basic_endpoint<boost::asio::ip::tcp> *)local_1d4);
    std::__cxx11::stringstream::str();
  }
  local_22c = 1;
  std::__cxx11::stringstream::~stringstream((stringstream *)&aec.cat_);
  return __return_storage_ptr__;
}

Assistant:

std::string get_remote_endpoint(lib::error_code & ec) const {
        std::stringstream s;

        lib::asio::error_code aec;
        lib::asio::ip::tcp::endpoint ep = m_socket->remote_endpoint(aec);

        if (aec) {
            ec = error::make_error_code(error::pass_through);
            s << "Error getting remote endpoint: " << aec
               << " (" << aec.message() << ")";
            return s.str();
        } else {
            ec = lib::error_code();
            s << ep;
            return s.str();
        }
    }